

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.c
# Opt level: O0

int lyd_toprint(lyd_node *node,int options)

{
  lyd_node *plVar1;
  int iVar2;
  lys_module *plVar3;
  bool bVar4;
  lyd_node *local_38;
  lyd_node *first;
  lys_node *sparent;
  lys_node *scase;
  int options_local;
  lyd_node *node_local;
  
  iVar2 = lyd_wd_toprint(node,options);
  if (iVar2 == 0) {
    first = (lyd_node *)lys_parent(node->schema);
    while( true ) {
      plVar1 = first;
      bVar4 = false;
      if (first != (lyd_node *)0x0) {
        bVar4 = *(int *)&first->ht == 0x1000;
      }
      if (!bVar4) break;
      first = (lyd_node *)lys_parent((lys_node *)first);
    }
    if ((first == (lyd_node *)0x0) || (*(int *)&first->ht != 0x40)) {
      node_local._4_4_ = 0;
    }
    else {
      first = (lyd_node *)lys_parent((lys_node *)first);
      while( true ) {
        bVar4 = false;
        if (first != (lyd_node *)0x0) {
          bVar4 = *(int *)&first->ht == 0x1000;
        }
        if (!bVar4) break;
        first = (lyd_node *)lys_parent((lys_node *)first);
      }
      if ((first == (lyd_node *)0x0) || (*(int *)&first->ht != 2)) {
        plVar3 = lyd_node_module(node);
        ly_log(plVar3->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
               "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/printer.c"
               ,0x3cb);
        node_local._4_4_ = 0;
      }
      else if (first[1].parent == plVar1) {
        node_local._4_4_ = 0;
      }
      else {
        local_38 = node->prev;
        while (local_38->prev->next != (lyd_node *)0x0) {
          local_38 = local_38->prev;
        }
        for (; local_38 != (lyd_node *)0x0; local_38 = local_38->next) {
          if (local_38 != node) {
            first = (lyd_node *)lys_parent(local_38->schema);
            while( true ) {
              bVar4 = false;
              if (first != (lyd_node *)0x0) {
                bVar4 = *(int *)&first->ht == 0x1000;
              }
              if (!bVar4) break;
              first = (lyd_node *)lys_parent((lys_node *)first);
            }
            if ((first == plVar1) && (iVar2 = lyd_wd_toprint(local_38,options), iVar2 != 0)) {
              return 0;
            }
          }
        }
        node_local._4_4_ = 1;
      }
    }
  }
  else {
    node_local._4_4_ = 1;
  }
  return node_local._4_4_;
}

Assistant:

int
lyd_toprint(const struct lyd_node *node, int options)
{
    struct lys_node *scase, *sparent;
    struct lyd_node *first;

    if (!lyd_wd_toprint(node, options)) {
        /* wd says do not print, but make exception for direct descendants of case nodes without other printable nodes */
        for (sparent = lys_parent(node->schema); sparent && (sparent->nodetype == LYS_USES); sparent = lys_parent(sparent));
        if (!sparent || (sparent->nodetype != LYS_CASE)) {
            /* parent not a case */
            return 0;
        }
        scase = sparent;

        for (sparent = lys_parent(scase); sparent && (sparent->nodetype == LYS_USES); sparent = lys_parent(sparent));
        if (!sparent || (sparent->nodetype != LYS_CHOICE)) {
            /* weird */
            LOGINT(lyd_node_module(node)->ctx);
            return 0;
        }
        if (((struct lys_node_choice *)sparent)->dflt == scase) {
            /* this is a default case, respect the previous original toprint flag */
            return 0;
        }

        /* try to find a sibling that will be printed */
        for (first = node->prev; first->prev->next; first = first->prev);
        LY_TREE_FOR(first, first) {
            if (first == node) {
                /* skip this node */
                continue;
            }

            /* find schema parent, whether it is the same case */
            for (sparent = lys_parent(first->schema); sparent && (sparent->nodetype == LYS_USES); sparent = lys_parent(sparent));
            if ((sparent == scase) && lyd_wd_toprint(first, options)) {
                /* this other node will be printed, we do not have to print the current one */
                return 0;
            }
        }

        /* there is no case child that will be printed, print this node */
        return 1;
    }

    return 1;
}